

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeSuperCall * __thiscall
Parser::CreateSuperCallNode(Parser *this,ParseNodeSpecialName *pnode1,ParseNodePtr pnode2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeSuperCall *this_00;
  ParseNodePtr pPVar4;
  
  if (this->m_deferringAST != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x49f,"(!this->m_deferringAST)","!this->m_deferringAST");
    if (!bVar2) goto LAB_00e6a11d;
    *puVar3 = 0;
  }
  if ((pnode1 == (ParseNodeSpecialName *)0x0) ||
     (((pnode1->super_ParseNodeName).field_0x29 & 2) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x4a0,"(pnode1 && pnode1->isSuper)","pnode1 && pnode1->isSuper");
    if (!bVar2) {
LAB_00e6a11d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (ParseNodeSuperCall *)new<Memory::ArenaAllocator>(0x38,&this->m_nodeAllocator,0x364470);
  pPVar4 = pnode2;
  if (pnode2 == (ParseNodePtr)0x0) {
    pPVar4 = (ParseNodePtr)pnode1;
  }
  ParseNodeSuperCall::ParseNodeSuperCall
            (this_00,knopCall,(pnode1->super_ParseNodeName).super_ParseNode.ichMin,pPVar4->ichLim,
             (ParseNode *)pnode1,pnode2);
  AddAstSize(this,0x38);
  return this_00;
}

Assistant:

ParseNodeSuperCall * Parser::CreateSuperCallNode(ParseNodeSpecialName * pnode1, ParseNodePtr pnode2)
{
    Assert(!this->m_deferringAST);
    Assert(pnode1 && pnode1->isSuper);

    ParseNodeSuperCall* pnode = Anew(&m_nodeAllocator, ParseNodeSuperCall, knopCall, pnode1->ichMin, pnode2 == nullptr ? pnode1->ichLim : pnode2->ichLim, pnode1, pnode2);
    AddAstSize(sizeof(ParseNodeSuperCall));
    return pnode;
}